

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

void skip_comment(FT_Byte **acur,FT_Byte *limit)

{
  FT_Byte *pFVar1;
  
  for (pFVar1 = *acur; ((pFVar1 < limit && (*pFVar1 != '\n')) && (*pFVar1 != '\r'));
      pFVar1 = pFVar1 + 1) {
  }
  *acur = pFVar1;
  return;
}

Assistant:

static void
  skip_comment( FT_Byte*  *acur,
                FT_Byte*   limit )
  {
    FT_Byte*  cur = *acur;


    while ( cur < limit )
    {
      if ( IS_PS_NEWLINE( *cur ) )
        break;
      cur++;
    }

    *acur = cur;
  }